

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O0

int ODDLParser::hex2Decimal(char in)

{
  bool bVar1;
  int local_14;
  int i;
  char hexCodeUpper;
  char hexCodeLower;
  char in_local;
  
  bVar1 = isNumeric<char>(in);
  if (bVar1) {
    i = in + -0x30;
  }
  else {
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      if (((int)in == local_14 + 0x61) || ((int)in == local_14 + 0x41)) {
        return local_14 + 10;
      }
    }
    i = 9999999;
  }
  return i;
}

Assistant:

inline
int hex2Decimal( char in ) {
    if( isNumeric( in ) ) {
        return ( in - 48 );
    }

    char hexCodeLower( 'a' ), hexCodeUpper( 'A' );
    for( int i = 0; i<16; i++ ) {
        if( in == hexCodeLower + i || in == hexCodeUpper + i ) {
            return ( i+10 );
        }
    }

    return ErrorHex2Decimal;
}